

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt,int sort)

{
  int iVar1;
  xmlXPathContextPtr pxVar2;
  byte *pbVar3;
  ulong uVar4;
  
  pxVar2 = ctxt->context;
  if (pxVar2 != (xmlXPathContextPtr)0x0) {
    if (4999 < pxVar2->depth) {
      xmlXPathErr(ctxt,0x1a);
      return;
    }
    pxVar2->depth = pxVar2->depth + 10;
  }
  xmlXPathCompAndExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar3 = ctxt->cur;
    while ((uVar4 = (ulong)*pbVar3, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
      ctxt->cur = pbVar3;
    }
    while (((int)uVar4 == 0x6f && (pbVar3[1] == 0x72))) {
      iVar1 = ctxt->comp->last;
      pbVar3 = pbVar3 + 2;
      while( true ) {
        ctxt->cur = pbVar3;
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        pbVar3 = pbVar3 + 1;
      }
      xmlXPathCompAndExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,iVar1,ctxt->comp->last,XPATH_OP_OR,0,0,0,(void *)0x0,(void *)0x0);
      pbVar3 = ctxt->cur;
      while ((uVar4 = (ulong)*pbVar3, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)))
      {
        pbVar3 = pbVar3 + 1;
        ctxt->cur = pbVar3;
      }
    }
    if ((sort != 0) && (iVar1 = ctxt->comp->last, ctxt->comp->steps[iVar1].op != XPATH_OP_VALUE)) {
      xmlXPathCompExprAdd(ctxt,iVar1,-1,XPATH_OP_SORT,0,0,0,(void *)0x0,(void *)0x0);
    }
    if (pxVar2 != (xmlXPathContextPtr)0x0) {
      pxVar2->depth = pxVar2->depth + -10;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt, int sort) {
    xmlXPathContextPtr xpctxt = ctxt->context;

    if (xpctxt != NULL) {
        if (xpctxt->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        /*
         * Parsing a single '(' pushes about 10 functions on the call stack
         * before recursing!
         */
        xpctxt->depth += 10;
    }

    xmlXPathCompAndExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'o') && (NXT(1) == 'r')) {
	int op1 = ctxt->comp->last;
        SKIP(2);
	SKIP_BLANKS;
        xmlXPathCompAndExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_OR, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
    if ((sort) && (ctxt->comp->steps[ctxt->comp->last].op != XPATH_OP_VALUE)) {
	/* more ops could be optimized too */
	/*
	* This is the main place to eliminate sorting for
	* operations which don't require a sorted node-set.
	* E.g. count().
	*/
	PUSH_UNARY_EXPR(XPATH_OP_SORT, ctxt->comp->last , 0, 0);
    }

    if (xpctxt != NULL)
        xpctxt->depth -= 10;
}